

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int __thiscall AActor::SpawnHealth(AActor *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  double dVar4;
  PClass *pPVar3;
  
  iVar1 = this->StartHealth;
  if (iVar1 == 0) {
    pPVar3 = (this->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(this->super_DThinker).super_DObject._vptr_DObject)();
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
      (this->super_DThinker).super_DObject.Class = pPVar3;
    }
    iVar1 = *(int *)(pPVar3->Defaults + 0x1fc);
  }
  iVar2 = iVar1;
  if ((((this->flags3).Value & 0x2000) != 0) && (iVar1 != 0)) {
    dVar4 = G_SkillProperty((((this->flags).Value >> 0x1b & 1) != 0) + SKILLP_MonsterHealth);
    iVar2 = 1;
    if (1 < (int)(dVar4 * (double)iVar1)) {
      iVar2 = (int)(dVar4 * (double)iVar1);
    }
  }
  return iVar2;
}

Assistant:

int AActor::SpawnHealth() const
{
	int defhealth = StartHealth ? StartHealth : GetDefault()->health;
	if (!(flags3 & MF3_ISMONSTER) || defhealth == 0)
	{
		return defhealth;
	}
	else if (flags & MF_FRIENDLY)
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_FriendlyHealth));
		return (adj <= 0) ? 1 : adj;
	}
	else
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_MonsterHealth));
		return (adj <= 0) ? 1 : adj;
	}
}